

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,string_view name,SourceLocation externalLoc,
          PortConcatenationSyntax *syntax)

{
  int iVar1;
  PortReferenceSyntax *syntax_00;
  Scope *pSVar2;
  Compilation *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SourceLocation externalLoc_00;
  Symbol *pSVar8;
  Diagnostic *this_01;
  long lVar9;
  undefined4 extraout_var;
  MultiPortSymbol *pMVar10;
  EVP_PKEY_CTX *pEVar11;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  Info *extraout_RDX_08;
  int iVar12;
  SourceRange SVar13;
  ArgumentDirection dir;
  SmallVector<const_slang::ast::PortSymbol_*,_5UL> buffer;
  int local_e0;
  int local_dc;
  ArgumentDirection local_c4;
  NonAnsiPortListBuilder *local_c0;
  PortConcatenationSyntax *local_b8;
  int *local_b0;
  ulong local_a8;
  Token local_a0;
  long local_90;
  SourceLocation local_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  SmallVectorBase<const_slang::ast::PortSymbol_*> local_70 [2];
  
  pEVar11 = (EVP_PKEY_CTX *)name._M_str;
  local_80._M_len = name._M_len;
  local_c4 = In;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_a8 = (syntax->references).elements._M_extent._M_extent_value + 1;
  local_b8 = syntax;
  local_88 = externalLoc;
  local_80._M_str = (char *)pEVar11;
  if (1 < local_a8) {
    local_a8 = local_a8 >> 1;
    bVar4 = true;
    lVar9 = 0;
    iVar6 = 0;
    local_e0 = 0;
    iVar12 = 0;
    local_dc = 0;
    bVar5 = true;
    bVar3 = false;
    local_c0 = this;
    do {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((local_b8->references).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar9));
      syntax_00 = (PortReferenceSyntax *)*ppSVar7;
      local_a0 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax_00);
      externalLoc_00 = parsing::Token::location(&local_a0);
      pSVar8 = createPort(this,(string_view)(ZEXT816(0x478002) << 0x40),externalLoc_00,syntax_00);
      local_90 = lVar9;
      if (pSVar8->kind == Port) {
        local_b0 = *(int **)(pSVar8 + 1);
        pEVar11 = extraout_RDX;
        this = local_c0;
        if (local_b0 != (int *)0x0) {
          local_a0._0_8_ = pSVar8;
          SmallVectorBase<slang::ast::PortSymbol_const*>::
          emplace_back<slang::ast::PortSymbol_const*>
                    ((SmallVectorBase<slang::ast::PortSymbol_const*> *)local_70,
                     (PortSymbol **)&local_a0);
          pSVar2 = local_c0->scope;
          pSVar8->parentScope = pSVar2;
          iVar1 = *(int *)&pSVar8[1].name._M_str;
          pEVar11 = extraout_RDX_00;
          if (iVar1 == 3) {
            local_c4 = Ref;
            iVar6 = 3;
            if ((bVar5) || (bVar3)) {
              local_e0 = 3;
              iVar12 = 3;
            }
            else {
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
              bVar3 = true;
              Scope::addDiag(pSVar2,(DiagCode)0x9c0006,SVar13);
              local_e0 = 3;
              iVar12 = 3;
              pEVar11 = extraout_RDX_03;
            }
          }
          else if (iVar1 == 2) {
            local_c4 = InOut;
            iVar6 = 2;
            if ((bVar4) || (bVar3)) {
              local_e0 = 2;
              iVar12 = 2;
            }
            else {
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
              bVar3 = true;
              Scope::addDiag(pSVar2,(DiagCode)0x9b0006,SVar13);
              local_e0 = 2;
              iVar12 = 2;
              pEVar11 = extraout_RDX_02;
            }
          }
          else if ((iVar1 == 1) && (local_dc == 0)) {
            local_c4 = Out;
            iVar6 = 1;
            local_e0 = 1;
            iVar12 = 1;
          }
          if (*local_b0 == 0x3b) {
            if ((local_e0 == 3) && (!bVar3)) {
              pSVar2 = local_c0->scope;
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
              bVar3 = true;
              Scope::addDiag(pSVar2,(DiagCode)0x9c0006,SVar13);
              pEVar11 = extraout_RDX_04;
            }
            this = local_c0;
            if (*(int *)(*(long *)(local_b0 + 0x54) + 0x80) == 0xd) {
              pSVar2 = local_c0->scope;
              SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
              Scope::addDiag(pSVar2,(DiagCode)0x510006,SVar13);
              pEVar11 = extraout_RDX_05;
            }
            else if (*(int *)(*(long *)(local_b0 + 0x54) + 0x80) == 0xc) {
              local_dc = iVar6;
              if (iVar6 == 2) {
                if (!bVar3) {
                  pSVar2 = local_c0->scope;
                  SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
                  Scope::addDiag(pSVar2,(DiagCode)0x9b0006,SVar13);
                  bVar3 = true;
                  pEVar11 = extraout_RDX_07;
                }
                local_dc = 2;
              }
              bVar5 = false;
              bVar4 = false;
              iVar6 = local_dc;
              iVar12 = local_dc;
              local_e0 = local_dc;
              goto LAB_0022b2f1;
            }
            bVar5 = false;
            local_dc = local_e0;
            iVar12 = local_e0;
          }
          else {
            this = local_c0;
            if (iVar12 == 2) {
              iVar12 = 2;
              if (bVar3) {
                bVar4 = false;
                local_dc = 2;
              }
              else {
                pSVar2 = local_c0->scope;
                SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_b8);
                Scope::addDiag(pSVar2,(DiagCode)0x9b0006,SVar13);
                bVar3 = true;
                bVar4 = false;
                local_dc = 2;
                iVar12 = 2;
                pEVar11 = extraout_RDX_06;
                this = local_c0;
              }
            }
            else {
              bVar4 = false;
              local_dc = iVar12;
            }
          }
        }
      }
      else {
        pSVar2 = this->scope;
        SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax_00);
        this_01 = Scope::addDiag(pSVar2,(DiagCode)0x450006,SVar13);
        Diagnostic::operator<<(this_01,pSVar8->name);
        pEVar11 = extraout_RDX_01;
      }
LAB_0022b2f1:
      lVar9 = local_90 + 0x30;
      local_a8 = local_a8 - 1;
    } while (local_a8 != 0);
  }
  this_00 = this->comp;
  iVar6 = SmallVectorBase<const_slang::ast::PortSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)this_00,pEVar11);
  local_a0.rawLen = extraout_var;
  local_a0.kind = (short)iVar6;
  local_a0._2_1_ = (char)((uint)iVar6 >> 0x10);
  local_a0.numFlags.raw = (char)((uint)iVar6 >> 0x18);
  local_a0.info = extraout_RDX_08;
  pMVar10 = BumpAllocator::
            emplace<slang::ast::MultiPortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::PortSymbol_const*,18446744073709551615ul>,slang::ast::ArgumentDirection&>
                      (&this_00->super_BumpAllocator,&local_80,&local_88,
                       (span<const_slang::ast::PortSymbol_*,_18446744073709551615UL> *)&local_a0,
                       &local_c4);
  (pMVar10->super_Symbol).originatingSyntax = (SyntaxNode *)local_b8;
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return &pMVar10->super_Symbol;
}

Assistant:

Symbol& createPort(std::string_view name, SourceLocation externalLoc,
                       const PortConcatenationSyntax& syntax) {
        ArgumentDirection dir = ArgumentDirection::In;
        SmallVector<const PortSymbol*> buffer;
        bool allNets = true;
        bool allVars = true;
        bool hadError = false;

        auto reportDirError = [&](DiagCode code) {
            if (!hadError) {
                scope.addDiag(code, syntax.sourceRange());
                hadError = true;
            }
        };

        for (auto item : syntax.references) {
            auto& port = createPort(""sv, item->getFirstToken().location(), *item);
            if (port.kind == SymbolKind::Port) {
                auto& ps = port.as<PortSymbol>();
                auto sym = ps.internalSymbol;
                if (!sym)
                    continue;

                buffer.push_back(&ps);
                ps.setParent(scope);

                // We need to merge the port direction with all of the other component port
                // directions to come up with our "effective" direction, which is what we use
                // to create connection expressions. The rules here are not spelled out in the
                // LRM, but here's what I think makes sense based on other language rules:
                // - If all the directions are the same, that's the effective direction.
                // - inputs and outputs can be freely mixed; output direction dominates.
                // - if any port is ref, all ports must be variables. Effective direction is ref.
                // - if any port is inout, all ports must be nets. Effective direction is inout.
                // - ref and inout can never mix (implied by above two points).
                if (ps.direction == ArgumentDirection::InOut) {
                    dir = ArgumentDirection::InOut;
                    if (!allNets)
                        reportDirError(diag::PortConcatInOut);
                }
                else if (ps.direction == ArgumentDirection::Ref) {
                    dir = ArgumentDirection::Ref;
                    if (!allVars)
                        reportDirError(diag::PortConcatRef);
                }
                else if (ps.direction == ArgumentDirection::Out && dir == ArgumentDirection::In) {
                    dir = ArgumentDirection::Out;
                }

                if (sym->kind == SymbolKind::Net) {
                    allVars = false;
                    if (dir == ArgumentDirection::Ref)
                        reportDirError(diag::PortConcatRef);

                    auto& net = sym->as<NetSymbol>();
                    if (net.netType.netKind == NetType::UWire) {
                        // UWire nets aren't resolvable nets and so act like variables
                        // for the purposes of these checks.
                        allNets = false;
                        if (dir == ArgumentDirection::InOut)
                            reportDirError(diag::PortConcatInOut);
                    }
                    else if (net.netType.netKind == NetType::Interconnect) {
                        // Can't use interconnects in a port concat.
                        scope.addDiag(diag::InterconnectMultiPort, item->sourceRange());
                    }
                }
                else {
                    allNets = false;
                    if (dir == ArgumentDirection::InOut)
                        reportDirError(diag::PortConcatInOut);
                }
            }
            else {
                auto& diag = scope.addDiag(diag::IfacePortInExpr, item->sourceRange());
                diag << port.name;
            }
        }

        auto result = comp.emplace<MultiPortSymbol>(name, externalLoc, buffer.copy(comp), dir);
        result->setSyntax(syntax);
        return *result;
    }